

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall
ON_OBSOLETE_V5_Annotation::SetType(ON_OBSOLETE_V5_Annotation *this,V5_eAnnotationType type)

{
  ON_AnnotationTextFormula *pOVar1;
  int iVar2;
  undefined7 in_register_00000031;
  wchar_t *s;
  
  this->m_type = type;
  iVar2 = (int)CONCAT71(in_register_00000031,type);
  if (iVar2 == 4) {
    s = ON_OBSOLETE_V5_DimRadial::DefaultDiameterText::defstr;
  }
  else if (iVar2 == 5) {
    s = ON_OBSOLETE_V5_DimRadial::DefaultRadiusText::defstr;
  }
  else {
    s = (wchar_t *)0x0;
  }
  ON_wString::operator=(&(this->m_usertext).super_ON_wString,s);
  (this->m_usertext).m_rect.left = 0;
  (this->m_usertext).m_rect.top = 0;
  (this->m_usertext).m_rect.right = 0;
  (this->m_usertext).m_rect.bottom = 0;
  pOVar1 = ON_AnnotationTextFormula::Get(this);
  if (pOVar1 != (ON_AnnotationTextFormula *)0x0) {
    (*(pOVar1->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar1);
    return;
  }
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::SetType( ON_INTERNAL_OBSOLETE::V5_eAnnotationType type ) 
{ 
  m_type = type;
  if(type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius)
    SetTextValue(ON_OBSOLETE_V5_DimRadial::DefaultRadiusText());
  else if(type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter)
    SetTextValue(ON_OBSOLETE_V5_DimRadial::DefaultDiameterText());
  else
    SetTextValue(0);

  SetTextFormula(0);
}